

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O0

void flatbuffers::tests::UnionDeprecationTest(string *tests_data_path)

{
  uchar *__first;
  bool bVar1;
  flatbuffers *pfVar2;
  uchar *__last;
  StructDef *pSVar3;
  SymbolTable<flatbuffers::FieldDef> *this;
  FieldDef *pFVar4;
  char *pcVar5;
  string *buf_00;
  string *local_dc8;
  string *local_db0;
  pointer *local_d98;
  bool *local_d28;
  string *local_d10;
  string *local_cf8;
  allocator<char> local_ce9;
  string local_ce8;
  FieldDef *local_cc8;
  FieldDef *j_type_field;
  string local_cb8;
  StructDef *local_c98;
  StructDef *v2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c88;
  uchar *local_c80;
  uint8_t *buf;
  undefined1 local_c70 [4];
  SizeT bufLen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  undefined1 local_c10 [8];
  string json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  undefined1 local_b90 [8];
  string schema;
  undefined1 local_b68 [4];
  int i;
  Parser parser;
  undefined1 local_3d8 [8];
  IDLOptions idl_opts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  string jsonfiles [2];
  string schemas [2];
  int NUM_VERSIONS;
  string *tests_data_path_local;
  
  schemas[1].field_2._12_4_ = 2;
  local_cf8 = (string *)(jsonfiles[1].field_2._M_local_buf + 8);
  do {
    std::__cxx11::string::string(local_cf8);
    local_cf8 = local_cf8 + 0x20;
  } while (local_cf8 != (string *)((long)&schemas[1].field_2 + 8));
  local_d10 = (string *)
              &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
  do {
    std::__cxx11::string::string(local_d10);
    local_d10 = local_d10 + 0x20;
  } while (local_d10 != (string *)((long)&jsonfiles[1].field_2 + 8));
  local_d28 = &idl_opts.grpc_python_typed_handlers;
  buf_00 = (string *)
           &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d28);
    local_d28 = (bool *)((long)local_d28 + 0x18);
  } while ((string *)local_d28 != buf_00);
  IDLOptions::IDLOptions((IDLOptions *)local_3d8);
  idl_opts.mini_reflect._1_1_ = idl_opts.mini_reflect._1_1_ | 1;
  Parser::Parser((Parser *)local_b68,(IDLOptions *)local_3d8);
  for (schema.field_2._12_4_ = 0; (int)schema.field_2._12_4_ < 2;
      schema.field_2._12_4_ = schema.field_2._12_4_ + 1) {
    std::operator+(&local_bd0,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>((string *)((long)&json.field_2 + 8),schema.field_2._12_4_ + 1);
    std::operator+(&local_bb0,&local_bd0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&json.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b90,
                   &local_bb0,".fbs");
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)(json.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_bd0);
    pfVar2 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(pfVar2,(char *)0x0,
                     (bool)((char)jsonfiles + '8' + (char)schema.field_2._12_4_ * ' '),buf_00);
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
    ;
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xa8,"");
    std::operator+(&local_c50,tests_data_path,"evolution_test/evolution_v");
    NumToString<int>((string *)local_c70,schema.field_2._12_4_ + 1);
    std::operator+(&local_c30,&local_c50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10,
                   &local_c30,".json");
    std::__cxx11::string::~string((string *)&local_c30);
    std::__cxx11::string::~string((string *)local_c70);
    std::__cxx11::string::~string((string *)&local_c50);
    pfVar2 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(pfVar2,(char *)0x0,
                     (bool)((char)binaries + '(' + (char)schema.field_2._12_4_ * ' '),
                     (string *)pcVar5);
    TestEq<bool,bool>(true,bVar1,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xab,"");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_b68,pcVar5,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xad,"");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_b68,pcVar5,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                      ,0xae,"");
    buf._4_4_ = FlatBufferBuilderImpl<false>::GetSize
                          ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
    local_c80 = FlatBufferBuilderImpl<false>::GetBufferPointer
                          ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &binaries[(long)(int)schema.field_2._12_4_ + -1].
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)buf._4_4_);
    __first = local_c80;
    buf_00 = (string *)(ulong)buf._4_4_;
    __last = local_c80 + (long)buf_00;
    local_c88 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &binaries[(long)(int)schema.field_2._12_4_ + -1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    v2 = (StructDef *)
         std::
         copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   (__first,__last,
                    (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     )local_c88);
    std::__cxx11::string::~string((string *)local_c10);
    std::__cxx11::string::~string((string *)local_b90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb8,"Evolution.V2.Root",(allocator<char> *)((long)&j_type_field + 7));
  pSVar3 = Parser::LookupStruct((Parser *)local_b68,&local_cb8);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j_type_field + 7));
  local_c98 = pSVar3;
  TestEq<bool,bool>(true,pSVar3 != (StructDef *)0x0,"\'nullptr\' == \'v2\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xb7,"");
  this = &local_c98->fields;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,"j_type",&local_ce9);
  pFVar4 = SymbolTable<flatbuffers::FieldDef>::Lookup(this,&local_ce8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  local_cc8 = pFVar4;
  TestEq<bool,bool>(true,pFVar4 != (FieldDef *)0x0,"\'nullptr\' == \'j_type_field\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xb9,"");
  TestEq<bool,bool>(true,(bool)(local_cc8->deprecated & 1),
                    "\'true\' != \'j_type_field->deprecated\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/evolution_test.cpp"
                    ,0xba,"");
  Parser::~Parser((Parser *)local_b68);
  IDLOptions::~IDLOptions((IDLOptions *)local_3d8);
  local_d98 = &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
  do {
    local_d98 = local_d98 + -3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d98);
  } while (local_d98 != (pointer *)&idl_opts.grpc_python_typed_handlers);
  local_db0 = (string *)(jsonfiles[1].field_2._M_local_buf + 8);
  do {
    local_db0 = local_db0 + -0x20;
    std::__cxx11::string::~string(local_db0);
  } while (local_db0 !=
           (string *)
           &binaries[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  local_dc8 = (string *)(schemas[1].field_2._M_local_buf + 8);
  do {
    local_dc8 = local_dc8 + -0x20;
    std::__cxx11::string::~string(local_dc8);
  } while (local_dc8 != (string *)((long)&jsonfiles[1].field_2 + 8));
  return;
}

Assistant:

void UnionDeprecationTest(const std::string &tests_data_path) {
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  auto v2 = parser.LookupStruct("Evolution.V2.Root");
  TEST_NOTNULL(v2);
  auto j_type_field = v2->fields.Lookup("j_type");
  TEST_NOTNULL(j_type_field);
  TEST_ASSERT(j_type_field->deprecated);
}